

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

QList<QFontDatabase::WritingSystem> * QFontDatabase::writingSystems(void)

{
  QtFontFamily *this;
  bool bVar1;
  Type *mutex;
  long lVar2;
  ulong uVar3;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_> *in_RDI;
  ulong uVar4;
  int i;
  long lVar5;
  uint x;
  ulong uVar6;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  mutex = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::
          operator()(in_RDI);
  QMutexLocker<QRecursiveMutex>::QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48,mutex);
  QFontDatabasePrivate::ensureFontDatabase();
  uVar6 = 1;
  uVar4 = 0;
  for (lVar5 = 0; lVar5 < QFontDatabasePrivate::instance::instance.count; lVar5 = lVar5 + 1) {
    this = QFontDatabasePrivate::instance::instance.families[lVar5];
    bVar1 = QtFontFamily::ensurePopulated(this);
    if ((bVar1) && (lVar2 = -0x21, this->count != 0)) {
      for (; lVar2 != 0; lVar2 = lVar2 + 1) {
        uVar3 = 0;
        if ((this->writingSystems[lVar2 + 0x22] & 1) != 0) {
          uVar3 = 1L << ((char)lVar2 + 0x22U & 0x3f);
        }
        uVar4 = uVar4 | uVar3;
      }
    }
  }
  QRecursiveMutex::unlock();
  local_48._8_8_ = local_48._8_8_ & 0xffffffffffffff00;
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  uVar3 = uVar4 - (uVar4 >> 1 & 0x5555555555555555);
  uVar3 = (uVar3 >> 2 & 0x3333333333333333) + (uVar3 & 0x3333333333333333);
  QList<QFontDatabase::WritingSystem>::reserve
            ((QList<QFontDatabase::WritingSystem> *)in_RDI,
             ((uVar3 >> 4) + uVar3 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
  for (; uVar6 != 0x22; uVar6 = uVar6 + 1) {
    if ((uVar4 >> (uVar6 & 0x3f) & 1) != 0) {
      QList<QFontDatabase::WritingSystem>::append
                ((QList<QFontDatabase::WritingSystem> *)in_RDI,(parameter_type)uVar6);
    }
  }
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QList<QFontDatabase::WritingSystem> *)in_RDI;
}

Assistant:

QList<QFontDatabase::WritingSystem> QFontDatabase::writingSystems()
{
    QMutexLocker locker(fontDatabaseMutex());
    QFontDatabasePrivate *d = QFontDatabasePrivate::ensureFontDatabase();

    quint64 writingSystemsFound = 0;
    static_assert(WritingSystemsCount < 64);

    for (int i = 0; i < d->count; ++i) {
        QtFontFamily *family = d->families[i];
        if (!family->ensurePopulated())
            continue;

        if (family->count == 0)
            continue;
        for (uint x = Latin; x < uint(WritingSystemsCount); ++x) {
            if (family->writingSystems[x] & QtFontFamily::Supported)
                writingSystemsFound |= quint64(1) << x;
        }
    }

    // mutex protection no longer needed - just working on local data now:
    locker.unlock();

    QList<WritingSystem> list;
    list.reserve(qPopulationCount(writingSystemsFound));
    for (uint x = Latin ; x < uint(WritingSystemsCount); ++x) {
        if (writingSystemsFound & (quint64(1) << x))
            list.push_back(WritingSystem(x));
    }
    return list;
}